

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall nnad::Matrix<double>::SetElement(Matrix<double> *this,int *i,int *j,double *value)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  iVar1 = *i;
  if ((iVar1 < 0) || (this->_Lines < iVar1)) {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"SetElement: line index out of range.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_30,local_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    iVar2 = *j;
    if ((-1 < iVar2) && (iVar2 <= this->_Columns)) {
      (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[this->_Columns * iVar1 + iVar2] = *value;
      return;
    }
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"SetElement: column index out of range.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_30,local_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  exit(-10);
}

Assistant:

void SetElement(int const& i, int const& j, T const& value)
    {
      if (i < 0 || i > _Lines)
        Error("SetElement: line index out of range.");

      if (j < 0 || j > _Columns)
        Error("SetElement: column index out of range.");

      _Matrix[i * _Columns + j] = value;
    }